

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwt.c
# Opt level: O2

OPJ_UINT32 dwt_max_resolution_v2(opj_tcd_resolution_v2_t *r,OPJ_UINT32 i)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  OPJ_INT32 *pOVar4;
  bool bVar5;
  
  pOVar4 = &r[1].y1;
  iVar3 = i - 1;
  uVar1 = 0;
  while( true ) {
    bVar5 = iVar3 == 0;
    iVar3 = iVar3 + -1;
    if (bVar5) break;
    uVar2 = pOVar4[-1] - ((opj_tcd_resolution_v2_t *)(pOVar4 + -3))->x0;
    if (uVar2 < uVar1) {
      uVar2 = uVar1;
    }
    uVar1 = *pOVar4 - pOVar4[-2];
    if ((uint)(*pOVar4 - pOVar4[-2]) < uVar2) {
      uVar1 = uVar2;
    }
    pOVar4 = pOVar4 + 0x2c;
  }
  return uVar1;
}

Assistant:

static OPJ_UINT32 dwt_max_resolution_v2(opj_tcd_resolution_v2_t* restrict r, OPJ_UINT32 i) {
	OPJ_UINT32 mr	= 0;
	OPJ_UINT32 w;
	while( --i ) {
		++r;
		if( mr < ( w = r->x1 - r->x0 ) )
			mr = w ;
		if( mr < ( w = r->y1 - r->y0 ) )
			mr = w ;
	}
	return mr ;
}